

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextHtmlExporter::emitFrame(QTextHtmlExporter *this,Iterator *frameIt)

{
  bool bVar1;
  QTextFrame *pQVar2;
  QTextFrame *pQVar3;
  QTextTable *pQVar4;
  iterator *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QTextTable *table;
  QTextFrame *f;
  Iterator it;
  Iterator next;
  QTextBlock *in_stack_00000248;
  QTextHtmlExporter *in_stack_00000250;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar5;
  iterator *in_stack_ffffffffffffff78;
  QTextFrame *in_stack_ffffffffffffff80;
  QTextHtmlExporter *in_stack_ffffffffffffff88;
  iterator local_70;
  iterator local_40;
  iterator local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QTextFrame::iterator::atEnd(in_RSI);
  if (!bVar1) {
    local_28.f = in_RSI->f;
    local_28.b = in_RSI->b;
    local_28.e = in_RSI->e;
    local_28.cf = in_RSI->cf;
    local_28.cb = in_RSI->cb;
    local_28._28_4_ = *(undefined4 *)&in_RSI->field_0x1c;
    QTextFrame::iterator::operator++(in_stack_ffffffffffffff78);
    bVar1 = QTextFrame::iterator::atEnd(&local_28);
    uVar5 = false;
    if (bVar1) {
      pQVar3 = QTextFrame::iterator::currentFrame(in_RSI);
      uVar5 = false;
      if (pQVar3 == (QTextFrame *)0x0) {
        pQVar3 = QTextFrame::iterator::parentFrame(in_RSI);
        pQVar2 = QTextDocument::rootFrame
                           ((QTextDocument *)CONCAT17(uVar5,in_stack_ffffffffffffff40));
        uVar5 = false;
        if (pQVar3 != pQVar2) {
          QTextFrame::iterator::currentBlock(in_RDI);
          QTextBlock::begin((QTextBlock *)in_RSI);
          uVar5 = QTextBlock::iterator::atEnd(&local_40);
        }
      }
    }
    if ((bool)uVar5 != false) goto LAB_007b1ae5;
    in_stack_ffffffffffffff47 = 0;
  }
  local_70.f = in_RSI->f;
  local_70.b = in_RSI->b;
  local_70.e = in_RSI->e;
  local_70.cf = in_RSI->cf;
  local_70.cb = in_RSI->cb;
  local_70._28_4_ = *(undefined4 *)&in_RSI->field_0x1c;
  while (bVar1 = QTextFrame::iterator::atEnd(&local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar3 = QTextFrame::iterator::currentFrame(&local_70);
    if (pQVar3 == (QTextFrame *)0x0) {
      QTextFrame::iterator::currentBlock(in_RDI);
      bVar1 = QTextBlock::isValid((QTextBlock *)
                                  CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      if (bVar1) {
        QTextFrame::iterator::currentBlock(in_RDI);
        emitBlock(in_stack_00000250,in_stack_00000248);
      }
    }
    else {
      pQVar4 = qobject_cast<QTextTable*>((QObject *)0x7b1a66);
      if (pQVar4 == (QTextTable *)0x0) {
        emitTextFrame(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        emitTable(this,(QTextTable *)frameIt);
      }
    }
    QTextFrame::iterator::operator++(in_stack_ffffffffffffff78);
  }
LAB_007b1ae5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitFrame(const QTextFrame::Iterator &frameIt)
{
    if (!frameIt.atEnd()) {
        QTextFrame::Iterator next = frameIt;
        ++next;
        if (next.atEnd()
            && frameIt.currentFrame() == nullptr
            && frameIt.parentFrame() != doc->rootFrame()
            && frameIt.currentBlock().begin().atEnd())
            return;
    }

    for (QTextFrame::Iterator it = frameIt;
         !it.atEnd(); ++it) {
        if (QTextFrame *f = it.currentFrame()) {
            if (QTextTable *table = qobject_cast<QTextTable *>(f)) {
                emitTable(table);
            } else {
                emitTextFrame(f);
            }
        } else if (it.currentBlock().isValid()) {
            emitBlock(it.currentBlock());
        }
    }
}